

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O2

uint8_t rfc5497_timetlv_encode(uint64_t decoded)

{
  char cVar1;
  uint8_t uVar2;
  
  if (decoded == 0) {
    uVar2 = '\0';
  }
  else {
    uVar2 = 0xff;
    if (decoded < 0xdac00001) {
      cVar1 = '\n';
      if (decoded < 1000) {
        for (; decoded < 1000; decoded = decoded * 2) {
          cVar1 = cVar1 + -1;
        }
      }
      else {
        for (; 0x753 < decoded; decoded = decoded + 1 >> 1) {
          cVar1 = cVar1 + '\x01';
        }
      }
      uVar2 = cVar1 * '\b' + (char)((decoded - 0x36c) / 0x7d);
    }
  }
  return uVar2;
}

Assistant:

uint8_t
rfc5497_timetlv_encode(uint64_t decoded) {
  uint32_t a, b;
  /*
   * t = (1 + a/8) * 2^b * 1000 / 1024
   *   = (1000 + 125 * a) * (2^b / 2^10)
   *   = (1000 + 125 * a) * 2 ^ (b-10)
   */

  if (decoded < RFC5497_TIMETLV_MIN) {
    return 0;
  }
  if (decoded > RFC5497_TIMETLV_MAX) {
    return 255;
  }

  b = 10;
  if (decoded >= 1000) {
    /* this means b >= 10 */
    while (decoded > 1875) {
      b++;

      /* divide by 2 and round up */
      decoded++;
      decoded >>= 1;
    }
  }
  else { /* decoded < 1000 */
    /* b < 10 */
    while (decoded < 1000) {
      b--;
      decoded <<= 1;
    }
  }

  a = (decoded - 1000 + 124) / 125;
  return a + (b << 3);
}